

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_3dVector * __thiscall
ON_SubDEdgePtr::RelativeDirection(ON_3dVector *__return_storage_ptr__,ON_SubDEdgePtr *this)

{
  uint uVar1;
  ulong uVar2;
  undefined1 local_50 [8];
  ON_3dPoint P1;
  ON_3dPoint P0;
  int i0;
  ON_SubDEdge *edge;
  ON_SubDEdgePtr *this_local;
  
  uVar2 = this->m_ptr & 0xfffffffffffffff8;
  if (((uVar2 == 0) || (*(long *)(uVar2 + 0x80) == 0)) || (*(long *)(uVar2 + 0x88) == 0)) {
    __return_storage_ptr__->x = ON_3dVector::NanVector.x;
    __return_storage_ptr__->y = ON_3dVector::NanVector.y;
    __return_storage_ptr__->z = ON_3dVector::NanVector.z;
  }
  else {
    uVar1 = (uint)((this->m_ptr & 1) != 0);
    ON_3dPoint::ON_3dPoint
              ((ON_3dPoint *)&P1.z,(double *)(*(long *)(uVar2 + 0x80 + (long)(int)uVar1 * 8) + 0x80)
              );
    ON_3dPoint::ON_3dPoint
              ((ON_3dPoint *)local_50,
               (double *)(*(long *)(uVar2 + 0x80 + (long)(int)(1 - uVar1) * 8) + 0x80));
    ON_3dPoint::operator-(__return_storage_ptr__,(ON_3dPoint *)local_50,(ON_3dPoint *)&P1.z);
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_3dVector ON_SubDEdgePtr::RelativeDirection() const
{
  for (;;)
  {
    const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(m_ptr);
    if (nullptr == edge)
      break;
    if (nullptr == edge->m_vertex[0] || nullptr == edge->m_vertex[1])
      break;
    const int i0 = (0 != ON_SUBD_EDGE_DIRECTION(m_ptr)) ? 1 : 0;
    const ON_3dPoint P0(edge->m_vertex[i0]->m_P);
    const ON_3dPoint P1(edge->m_vertex[1-i0]->m_P);
    return (P1 - P0);
  }
  return ON_3dVector::NanVector;
}